

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void plot_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey,
             int tovis)

{
  double dVar1;
  t_object *ptVar2;
  _fielddesc *p_Var3;
  float fVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _glist *extraout_RAX;
  _glist *p_Var7;
  _glist *extraout_RAX_00;
  _glist *extraout_RAX_01;
  _glist *p_Var8;
  undefined4 extraout_var_02;
  _glist *x;
  _parentwidgetbehavior *p_Var9;
  _glist *extraout_RAX_02;
  _glist *x_00;
  ulong uVar10;
  t_gobj **pptVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  t_gobj *ptVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  t_pd *pp_Var19;
  long lVar20;
  t_float tVar21;
  float fVar22;
  t_float tVar23;
  t_float tVar24;
  float fVar25;
  float fVar26;
  t_float *xlocp;
  t_float *stylep;
  undefined4 uVar27;
  undefined8 uVar28;
  undefined4 uVar29;
  undefined8 uVar30;
  undefined4 uVar31;
  int elemsize;
  double local_41f0;
  double local_41e8;
  _fielddesc *local_41e0;
  ulong local_41d8;
  _glist *local_41d0;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  t_float linewidth;
  undefined8 local_41b8;
  t_float tStack_41b0;
  t_float tStack_41ac;
  ulong local_41a8;
  _glist *local_41a0;
  t_gobj **local_4198;
  _glist *local_4190;
  _fielddesc *local_4188;
  _glist *local_4180;
  t_float scalarvis;
  undefined8 local_4170;
  undefined8 local_4168;
  t_float local_4160;
  t_float vis;
  t_float style;
  int xonset;
  int wonset;
  int yonset;
  t_template *elemtemplate;
  _glist *elemtemplatecanvas;
  undefined1 local_4138 [16];
  char *tags [3];
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_float edit;
  char tag0 [80];
  char tag [80];
  t_word coordinates [2048];
  
  local_4198 = (t_gobj **)CONCAT44(local_4198._4_4_,tovis);
  local_41d0 = (_glist *)CONCAT44(local_41d0._4_4_,basex);
  tags[0] = tag;
  tags[1] = tag0;
  tags[2] = "array";
  stylep = &style;
  xlocp = &xloc;
  uVar10 = 0;
  local_41b8 = z;
  iVar5 = plot_readownertemplate
                    ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,xlocp,&xinc,&yloc,
                     stylep,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
  if (iVar5 != 0) {
    return;
  }
  if (((local_4198._0_4_ != 0.0) && (vis == 0.0)) && (!NAN(vis))) {
    return;
  }
  uVar28 = 0;
  iVar5 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,xfielddesc,
                          yfielddesc,wfielddesc,&xonset,&yonset,&wonset);
  if (iVar5 != 0) {
    return;
  }
  local_4188 = yfielddesc;
  local_41a0 = (_glist *)(long)array->a_n;
  p_Var8 = (_glist *)array->a_vec;
  sprintf(tag,"plot%lx",data);
  local_41e8 = (double)(ulong)(uint)wonset;
  uVar13 = (ulong)(uint)xonset;
  local_41d8 = (ulong)(uint)yonset;
  uVar30 = 0;
  local_4180 = p_Var8;
  iVar5 = sprintf(tag0,"plot%lx_array%lx_onset%+d%+d%+d",data,p_Var8,local_41e8,uVar13,local_41d8);
  p_Var8 = (_glist *)CONCAT44(extraout_var,iVar5);
  if ((glist->field_0xe9 & 1) != 0) {
    iVar5 = glist_getzoom(glist);
    p_Var8 = (_glist *)CONCAT44(extraout_var_00,iVar5);
    linewidth = (float)iVar5 * linewidth;
  }
  iVar5 = (int)local_4198._0_4_;
  if (local_4198._0_4_ == 0.0) {
    if ((scalarvis != 0.0) || (NAN(scalarvis))) {
      local_4198 = &elemtemplatecanvas->gl_list;
      p_Var8 = (_glist *)(long)elemsize;
      uVar10 = 0;
      uVar13 = (ulong)local_41a0 & 0xffffffff;
      local_41d0 = p_Var8;
      if ((int)local_41a0 < 1) {
        uVar13 = 0;
      }
      for (; uVar10 != uVar13; uVar10 = uVar10 + 1) {
        lVar20 = uVar10 * (long)local_41d0;
        ptVar2 = &local_4180->gl_obj;
        pptVar11 = local_4198;
        while (ptVar15 = *pptVar11, ptVar15 != (t_gobj *)0x0) {
          p_Var8 = (_glist *)pd_getparentwidget(&ptVar15->g_pd);
          if (p_Var8 != (_glist *)0x0) {
            p_Var8 = (_glist *)
                     (*(code *)(p_Var8->gl_obj).te_inlet)
                               (0,0,ptVar15,glist,(t_pd *)((long)&(ptVar2->te_g).g_pd + lVar20),
                                elemtemplate,0);
          }
          pptVar11 = &ptVar15->g_next;
        }
      }
    }
    p_Var8 = glist_getcanvas(p_Var8);
    pdgui_vmess((char *)0x0,"crs",p_Var8,"delete",tag);
    return;
  }
  tVar21 = fielddesc_getfloat((_fielddesc *)&local_41b8[3].g_next,template,data,1);
  iVar6 = numbertocolor((int)tVar21);
  local_4168 = CONCAT44(extraout_var_01,iVar6);
  local_41e0 = xfielddesc;
  iVar6 = (int)local_41a0;
  if ((style == 0.0) && (!NAN(style))) {
    fVar22 = xloc + local_41d0._0_4_;
    local_41b8 = (t_gobj *)(double)fVar22;
    dVar1 = (double)xinc;
    local_41f0 = (double)(long)elemsize;
    local_4170 = CONCAT44(local_4170._4_4_,yloc);
    local_41a8 = (ulong)(iVar6 - 1);
    uVar10 = 0;
    local_41e8 = 0.0;
    if (0 < iVar6) {
      local_41e8 = (double)((ulong)local_41a0 & 0xffffffff);
    }
    local_4160 = linewidth;
    tVar21 = 1e+20;
    fVar25 = -1e+20;
    iVar6 = 0;
    p_Var8 = local_4180;
    for (; p_Var3 = local_41e0, local_41e8 != (double)uVar10; uVar10 = uVar10 + 1) {
      if (xonset < 0) {
        fVar26 = (float)(double)local_41b8;
        local_41b8 = (t_gobj *)((double)local_41b8 + dVar1);
        tVar23 = fielddesc_cvttocoord(local_41e0,fVar26);
        tVar23 = glist_xtopixels(glist,tVar23);
        uVar18 = (uint)tVar23;
        tVar23 = fielddesc_cvttocoord(p_Var3,(float)(double)local_41b8);
        tVar23 = glist_xtopixels(glist,tVar23);
        uVar16 = (uint)tVar23;
      }
      else {
        tVar23 = fielddesc_cvttocoord
                           (local_41e0,
                            *(float *)((long)&(p_Var8->gl_obj).te_g.g_pd + uVar13) + fVar22);
        tVar23 = glist_xtopixels(glist,tVar23);
        uVar18 = (uint)tVar23;
        uVar16 = uVar18 + 2;
      }
      fVar26 = 0.0;
      if (-1 < (int)local_41d8) {
        fVar26 = *(float *)((long)&(p_Var8->gl_obj).te_g.g_pd + local_41d8) + (float)local_4170;
      }
      if (1e+20 <= ABS(fVar26)) {
        fVar26 = 0.0;
      }
      fVar4 = fVar26;
      if (tVar21 <= fVar26) {
        fVar4 = tVar21;
      }
      tVar21 = fVar4;
      if (fVar26 <= fVar25) {
        fVar26 = fVar25;
      }
      fVar25 = fVar26;
      if ((local_41a8 == uVar10) || (uVar16 != uVar18)) {
        local_4138 = ZEXT416((uint)fVar25);
        local_4190 = glist_getcanvas(p_Var8);
        p_Var3 = local_4188;
        tVar21 = fielddesc_cvttocoord(local_4188,tVar21);
        tVar21 = glist_ytopixels(glist,tVar21 + basey);
        tVar23 = fielddesc_cvttocoord(p_Var3,(t_float)local_4138._0_4_);
        tVar23 = glist_ytopixels(glist,tVar23 + basey);
        pdgui_vmess((char *)0x0,"crr iiii rk rf rS",0,local_4190,"create","rectangle",(ulong)uVar18,
                    (ulong)(uint)(int)tVar21,(ulong)uVar16,(ulong)(uint)(int)(tVar23 + local_4160),
                    "-fill",local_4168,"-width","-tags",3,tags);
        if (1999 < iVar6) break;
        iVar6 = iVar6 + 1;
        tVar21 = 1e+20;
        fVar25 = -1e+20;
      }
      p_Var8 = (_glist *)((long)&(p_Var8->gl_obj).te_g.g_pd + (long)local_41f0);
    }
    goto LAB_00154c46;
  }
  if (-1 < local_41e8._0_4_) {
    local_4170 = 1;
    local_4190 = (_glist *)wfielddesc;
    local_41a8 = CONCAT44(local_41a8._4_4_,xloc);
    local_41b8 = (t_gobj *)(double)xloc;
    local_4138._0_8_ = (double)xinc;
    lVar20 = (long)elemsize;
    fVar22 = yloc + basey;
    uVar16 = 0;
    uVar10 = 0;
    if (0 < iVar6) {
      uVar10 = (ulong)local_41a0 & 0xffffffff;
    }
    lVar14 = uVar10 + 1;
    tVar21 = 0.0;
    tVar23 = 0.0;
    iVar6 = 0;
    p_Var8 = local_4180;
    iVar5 = -1;
    do {
      lVar14 = lVar14 + -1;
      if (lVar14 == 0) {
        pp_Var19 = (t_pd *)((long)&(local_4180->gl_obj).te_g.g_pd +
                           (long)((long)&local_41a0[-1].gl_privatedata + 7) * lVar20);
        p_Var7 = (_glist *)-lVar20;
        ptVar15 = (t_gobj *)((long)&(local_41a0->gl_obj).te_g.g_pd + 1);
        iVar5 = -1;
        goto LAB_00154909;
      }
      if (xonset < 0) {
        tVar21 = (t_float)(double)local_41b8;
        local_41b8 = (t_gobj *)((double)local_41b8 + (double)local_4138._0_8_);
      }
      else {
        tVar21 = *(float *)((long)&(p_Var8->gl_obj).te_g.g_pd + uVar13) + (float)local_41a8;
      }
      if ((int)local_41d8 < 0) {
        fVar25 = 0.0;
      }
      else {
        fVar25 = *(float *)((long)&(p_Var8->gl_obj).te_g.g_pd + local_41d8);
      }
      fVar26 = *(float *)((long)&(p_Var8->gl_obj).te_g.g_pd + (long)local_41e8);
      tVar21 = fielddesc_cvttocoord(local_41e0,tVar21);
      tVar24 = glist_xtopixels(glist,tVar21 + local_41d0._0_4_);
      tVar21 = (t_float)(-(uint)(ABS(fVar25) < 1e+20) & (uint)fVar25);
      tVar23 = (t_float)(-(uint)(ABS(fVar26) < 1e+20) & (uint)fVar26);
      iVar6 = (int)(tVar24 + 0.5);
      if ((-1 < xonset) || (p_Var7 = extraout_RAX, iVar5 != iVar6)) {
        coordinates[(int)(uVar16 * 2)].w_float = (float)iVar6;
        tVar24 = fielddesc_cvttocoord(local_4188,tVar21);
        local_41f0 = (double)CONCAT44(local_41f0._4_4_,tVar24 + fVar22);
        tVar24 = fielddesc_cvttocoord((_fielddesc *)local_4190,tVar23);
        tVar24 = glist_ytopixels(glist,local_41f0._0_4_ - tVar24);
        p_Var7 = (_glist *)(long)(int)(uVar16 * 2 + 1);
        coordinates[(long)p_Var7].w_float = tVar24;
        uVar16 = uVar16 + 1;
      }
      p_Var8 = (_glist *)((long)&(p_Var8->gl_obj).te_g.g_pd + lVar20);
      iVar5 = iVar6;
    } while ((uVar16 & 0x7ffffc00) == 0);
    goto LAB_00154b42;
  }
  fVar22 = 0.0;
  local_4190 = (_glist *)CONCAT44(local_4190._4_4_,linewidth);
  if (linewidth <= 0.0) goto LAB_00154c46;
  local_41a8 = CONCAT44(local_41a8._4_4_,xloc);
  local_41e8 = (double)xloc;
  dVar1 = (double)xinc;
  local_41b8 = (t_gobj *)(long)elemsize;
  local_41f0 = (double)CONCAT44(local_41f0._4_4_,yloc + basey);
  uVar16 = 0;
  uVar12 = 0;
  if (0 < iVar6) {
    uVar12 = (ulong)local_41a0 & 0xffffffff;
  }
  lVar20 = uVar12 + 1;
  iVar17 = 0;
  p_Var8 = local_41a0;
  p_Var7 = local_4180;
  iVar6 = -1;
  do {
    uVar31 = (undefined4)((ulong)uVar30 >> 0x20);
    uVar27 = (undefined4)((ulong)stylep >> 0x20);
    uVar29 = (undefined4)((ulong)uVar28 >> 0x20);
    lVar20 = lVar20 + -1;
    if (lVar20 == 0) {
      if (uVar16 == 0) goto LAB_00154c46;
      if (uVar16 == 1) {
        coordinates[2]._0_4_ = (undefined4)(iVar17 + 10);
        tVar21 = fielddesc_cvttocoord(local_4188,fVar22);
        coordinates[3]._0_4_ = glist_ytopixels(glist,tVar21 + local_41f0._0_4_);
        uVar16 = 2;
        p_Var8 = extraout_RAX_02;
      }
      break;
    }
    if (xonset < 0) {
      tVar21 = (t_float)local_41e8;
      local_41e8 = local_41e8 + dVar1;
    }
    else {
      tVar21 = *(float *)((long)&(p_Var7->gl_obj).te_g.g_pd + uVar13) + (float)local_41a8;
    }
    fVar22 = 0.0;
    if (-1 < (int)local_41d8) {
      fVar22 = *(float *)((long)&(p_Var7->gl_obj).te_g.g_pd + local_41d8);
    }
    if (1e+20 <= ABS(fVar22)) {
      fVar22 = 0.0;
    }
    tVar21 = fielddesc_cvttocoord(local_41e0,tVar21);
    tVar21 = glist_xtopixels(glist,tVar21 + local_41d0._0_4_);
    iVar17 = (int)(tVar21 + 0.5);
    if ((-1 < xonset) || (p_Var8 = extraout_RAX_00, iVar6 != iVar17)) {
      coordinates[(int)(uVar16 * 2)].w_float = (float)iVar17;
      tVar21 = fielddesc_cvttocoord(local_4188,fVar22);
      tVar21 = glist_ytopixels(glist,tVar21 + local_41f0._0_4_);
      p_Var8 = (_glist *)(long)(int)(uVar16 * 2 + 1);
      coordinates[(long)p_Var8].w_float = tVar21;
      uVar16 = uVar16 + 1;
    }
    uVar31 = (undefined4)((ulong)uVar30 >> 0x20);
    uVar27 = (undefined4)((ulong)stylep >> 0x20);
    uVar29 = (undefined4)((ulong)uVar28 >> 0x20);
    p_Var7 = (_glist *)((long)&(p_Var7->gl_obj).te_g.g_pd + (long)local_41b8);
    iVar6 = iVar17;
  } while ((uVar16 & 0x7ffffc00) == 0);
  p_Var8 = glist_getcanvas(p_Var8);
  pdgui_vmess((char *)0x0,"crr iiii rf rk ri rS",SUB84((double)local_4190._0_4_,0),p_Var8,"create",
              "line",0,0,uVar10 & 0xffffffff00000000,(ulong)xlocp & 0xffffffff00000000,"-width",
              "-fill",CONCAT44(uVar27,(int)local_4168),"-smooth",
              CONCAT44(uVar29,-(uint)(style == 2.0)) & 0xffffffff00000001,"-tags",CONCAT44(uVar31,3)
              ,tags);
  p_Var8 = glist_getcanvas(x_00);
  goto LAB_00154c02;
  while( true ) {
    if (xonset < 0) {
      local_41b8 = (t_gobj *)((double)local_41b8 - (double)local_4138._0_8_);
      tVar21 = (t_float)(double)local_41b8;
    }
    else {
      tVar21 = *(float *)((long)pp_Var19 + uVar13) + (float)local_41a8;
    }
    if ((int)local_41d8 < 0) {
      fVar25 = 0.0;
    }
    else {
      fVar25 = *(float *)((long)pp_Var19 + local_41d8);
    }
    fVar26 = *(float *)((long)pp_Var19 + (long)local_41e8);
    tVar21 = fielddesc_cvttocoord(local_41e0,tVar21);
    tVar24 = glist_xtopixels(glist,tVar21 + local_41d0._0_4_);
    tVar21 = (t_float)(-(uint)(ABS(fVar25) < 1e+20) & (uint)fVar25);
    tVar23 = (t_float)(-(uint)(ABS(fVar26) < 1e+20) & (uint)fVar26);
    iVar6 = (int)(tVar24 + 0.5);
    if ((-1 < xonset) || (p_Var7 = extraout_RAX_01, iVar5 != iVar6)) {
      coordinates[(int)(uVar16 * 2)].w_float = (float)iVar6;
      tVar24 = fielddesc_cvttocoord(local_4188,tVar21);
      local_41f0 = (double)CONCAT44(local_41f0._4_4_,tVar24 + fVar22);
      tVar24 = fielddesc_cvttocoord((_fielddesc *)local_4190,tVar23);
      tVar24 = glist_ytopixels(glist,tVar24 + local_41f0._0_4_);
      p_Var7 = (_glist *)(long)(int)(uVar16 * 2 + 1);
      coordinates[(long)p_Var7].w_float = tVar24;
      uVar16 = uVar16 + 1;
    }
    pp_Var19 = (t_pd *)((long)pp_Var19 + -lVar20);
    ptVar15 = (t_gobj *)((long)(ptVar15 + 0xffffffffffffffff) + 0xfU);
    iVar5 = iVar6;
    if ((uVar16 & 0x7ffffc00) != 0) break;
LAB_00154909:
    p_Var3 = local_4188;
    if ((t_gobj *)((long)(ptVar15 + 0xffffffffffffffff) + 0xfU) == (t_gobj *)0x0 ||
        (long)ptVar15 < 1) {
      if ((int)uVar16 < 4) {
        coordinates[(int)(uVar16 * 2)].w_float = (float)(iVar6 + 10);
        tVar24 = fielddesc_cvttocoord(local_4188,tVar21);
        p_Var8 = local_4190;
        local_41e0 = (_fielddesc *)CONCAT44(local_41e0._4_4_,tVar24 + fVar22);
        local_41b8 = (t_gobj *)CONCAT44(tVar23,tVar23);
        tStack_41b0 = tVar23;
        tStack_41ac = tVar23;
        tVar23 = fielddesc_cvttocoord((_fielddesc *)local_4190,tVar23);
        tVar23 = glist_ytopixels(glist,local_41e0._0_4_ - tVar23);
        coordinates[(int)(uVar16 * 2 + 1)].w_float = tVar23;
        coordinates[(int)(uVar16 * 2 + 2)].w_float = (float)(iVar6 + 10);
        tVar21 = fielddesc_cvttocoord(p_Var3,tVar21);
        tVar23 = fielddesc_cvttocoord((_fielddesc *)p_Var8,(t_float)local_41b8);
        tVar21 = glist_ytopixels(glist,tVar23 + tVar21 + fVar22);
        p_Var7 = (_glist *)(long)(int)(uVar16 * 2 + 3);
        coordinates[(long)p_Var7].w_float = tVar21;
        uVar16 = uVar16 + 2;
      }
      break;
    }
  }
LAB_00154b42:
  p_Var8 = glist_getcanvas(p_Var7);
  if ((glist->field_0xe9 & 1) != 0) {
    iVar5 = glist_getzoom(glist);
    local_4170 = CONCAT44(extraout_var_02,iVar5);
  }
  pdgui_vmess((char *)0x0,"crr ri rk rk ri rS",p_Var8,"create","polygon","-width",local_4170,"-fill"
              ,local_4168,"-outline",local_4168,"-smooth",(ulong)(-(uint)(style == 2.0) & 1),"-tags"
              ,3,tags);
  p_Var8 = glist_getcanvas(x);
  iVar5 = (int)local_4198._0_4_;
LAB_00154c02:
  pdgui_vmess((char *)0x0,"crs w",p_Var8,"coords",tag0,(ulong)(uVar16 * 2),coordinates);
LAB_00154c46:
  if ((scalarvis != 0.0) || (NAN(scalarvis))) {
    local_41b8 = (t_gobj *)(double)xloc;
    local_41f0 = (double)xinc;
    dVar1 = (double)local_41d0._0_4_;
    local_41e0 = (_fielddesc *)CONCAT44(local_41e0._4_4_,xloc + local_41d0._0_4_);
    local_41e8 = (double)((long)&(local_4180->gl_obj).te_g.g_pd + uVar13);
    local_41a8 = (long)&(local_4180->gl_obj).te_g.g_pd + local_41d8;
    uVar10 = 0;
    iVar6 = (int)local_41a0;
    local_41a0 = (_glist *)((ulong)local_41a0 & 0xffffffff);
    if (iVar6 < 1) {
      local_41a0 = (_glist *)uVar10;
    }
    for (; (_glist *)uVar10 != local_41a0; uVar10 = uVar10 + 1) {
      if (xonset < 0) {
        fVar22 = (float)((double)local_41b8 + dVar1);
        local_41b8 = (t_gobj *)((double)local_41b8 + local_41f0);
      }
      else {
        fVar22 = *(float *)((long)local_41e8 + uVar10 * (long)elemsize) + local_41e0._0_4_;
      }
      local_4198 = (t_gobj **)CONCAT44(local_4198._4_4_,fVar22);
      lVar20 = uVar10 * (long)elemsize;
      if ((int)local_41d8 < 0) {
        tVar21 = 0.0;
      }
      else {
        tVar21 = *(t_float *)(local_41a8 + lVar20);
      }
      tVar21 = fielddesc_cvttocoord(local_4188,tVar21);
      local_41d0 = (_glist *)CONCAT44(local_41d0._4_4_,tVar21 + basey + yloc);
      ptVar2 = &local_4180->gl_obj;
      pptVar11 = &elemtemplatecanvas->gl_list;
      while (ptVar15 = *pptVar11, ptVar15 != (t_gobj *)0x0) {
        p_Var9 = pd_getparentwidget(&ptVar15->g_pd);
        if (p_Var9 != (_parentwidgetbehavior *)0x0) {
          (*p_Var9->w_parentvisfn)
                    (ptVar15,glist,(t_word *)((long)&(ptVar2->te_g).g_pd + lVar20),elemtemplate,
                     local_4198._0_4_,local_41d0._0_4_,iVar5);
        }
        pptVar11 = &ptVar15->g_next;
      }
    }
  }
  return;
}

Assistant:

static void plot_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int tovis)
{
    t_plot *x = (t_plot *)z;
    int elemsize, yonset, wonset, xonset, i;
    t_canvas *elemtemplatecanvas;
    t_template *elemtemplate;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, yval,
        vis, scalarvis, edit;
    double xsum;
    t_array *array;
    int nelem;
    char *elem;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;
    char tag[80], tag0[80];
    const char*tags[] = {tag, tag0, "array"};
        /* even if the array is "invisible", if its visibility is
        set by an instance variable you have to explicitly erase it,
        because the flag could earlier have been on when we were getting
        drawn.  Rather than look to try to find out whether we're
        visible we just do the erasure.  At the TK level this should
        cause no action because the tag matches nobody.  LATER we
        might want to optimize this somehow.  Ditto the "vis()" routines
        for other drawing instructions. */

    if (plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit, &xfielddesc, &yfielddesc, &wfielddesc) ||
            ((vis == 0) && tovis) /* see above for 'tovis' */
            || array_getfields(elemtemplatesym, &elemtemplatecanvas,
                &elemtemplate, &elemsize, xfielddesc, yfielddesc, wfielddesc,
                &xonset, &yonset, &wonset))
                    return;
    nelem = array->a_n;
    elem = (char *)array->a_vec;

    sprintf(tag , "plot%lx", data);
        /* a tag that uniquely identifies the sub-plot */
    sprintf(tag0, "plot%lx_array%lx_onset%+d%+d%+d", data, elem, wonset, xonset, yonset);

    if (glist->gl_isgraph)
        linewidth *= glist_getzoom(glist);

    if (tovis)
    {
         /* we use t_word because pdgui_vmess() has a convenient FLOATWORDS type
          * FLOATARRAY is impractical (as it sends a list, and the GUI expects arguments)
          */
        t_word coordinates[1024*2];

        if (style == PLOTSTYLE_POINTS)
        {
            t_float minyval = 1e20, maxyval = -1e20;
            int ndrawn = 0;
            int color = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            for (xsum = basex + xloc, i = 0; i < nelem; i++)
            {
                t_float yval, xpix, ypix, nextxloc, usexloc;
                int ixpix, inextx;

                if (xonset >= 0)
                {
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = ixpix + 2;
                }
                else
                {
                    usexloc = xsum;
                    xsum += xinc;
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, xsum));
                }

                if (yonset >= 0)
                    yval = yloc + *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                yval = CLIP(yval);
                if (yval < minyval)
                    minyval = yval;
                if (yval > maxyval)
                    maxyval = yval;
                if (i == nelem-1 || inextx != ixpix)
                {

                    pdgui_vmess(0, "crr iiii rk rf rS",
                        glist_getcanvas(glist), "create", "rectangle",
                        ixpix , (int) glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, minyval)),
                        inextx, (int)(glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, maxyval)) + linewidth),
                        "-fill", color,
                        "-width", 0.,
                        "-tags", 3, tags);
                    ndrawn++;
                    minyval = 1e20;
                    maxyval = -1e20;
                }
                if (ndrawn > 2000) break;
            }
        }
        else
        {
            int outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));
            int lastpixel = -1, ndrawn = 0;
            t_float yval = 0, wval = 0, xpix;
            int ixpix = 0;
                /* draw the trace */


            if (wonset >= 0)
            {
                    /* found "w" field which controls linewidth.  The trace is
                    a filled polygon with 2n points. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            - fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }
                lastpixel = -1;
                for (i = nelem-1; i >= 0; i--)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else xsum -= xinc, usexloc = xsum;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            + fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }

                    /* TK will complain if there aren't at least 3 points.
                    There should be at least two already. */
                if (ndrawn < 4)
                {
                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        - fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;

                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        + fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;
                }
            ouch:

                pdgui_vmess(0, "crr ri rk rk ri rS",
                    glist_getcanvas(glist), "create", "polygon",
                    "-width", (glist->gl_isgraph ? glist_getzoom(glist) : 1),
                    "-fill", outline,
                    "-outline", outline,
                    "-smooth", (style == PLOTSTYLE_BEZ),
                    "-tags", 3, tags);

                pdgui_vmess(0, "crs w",
                    glist_getcanvas(glist), "coords", tag0,
                    ndrawn*2, coordinates);
            }
            else if (linewidth > 0)
            {
                    /* no "w" field.  If the linewidth is positive, draw a
                    segmented line with the requested width; otherwise don't
                    draw the trace at all. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);


                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates)) break;
                }

                    /* TK will complain if there aren't at least 2 points... */
                if (ndrawn == 1)
                {
                    coordinates[2].w_float = ixpix + 10;
                    coordinates[3].w_float = glist_ytopixels(glist, basey + yloc + fielddesc_cvttocoord(yfielddesc, yval));
                    ndrawn = 2;
                }

                if(ndrawn)
                {
                    pdgui_vmess(0, "crr iiii rf rk ri rS",
                        glist_getcanvas(glist), "create", "line",
                        0, 0, 0, 0,
                        "-width", linewidth,
                        "-fill", outline,
                        "-smooth", (style == PLOTSTYLE_BEZ),
                        "-tags", 3, tags);
                    pdgui_vmess(0, "crs w",
                        glist_getcanvas(glist), "coords", tag0,
                        ndrawn*2, coordinates);
                }
            }
        }
            /* We're done with the outline; now draw all the points.
            This code is inefficient since the template has to be
            searched for drawing instructions for every last point. */
        if (scalarvis != 0)
        {
            for (xsum = xloc, i = 0; i < nelem; i++)
            {
                t_float usexloc, useyloc;
                t_gobj *y;
                if (xonset >= 0)
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                else usexloc = basex + xsum, xsum += xinc;
                if (yonset >= 0)
                    yval = *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                useyloc = basey + yloc +
                    fielddesc_cvttocoord(yfielddesc, yval);
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i),
                            elemtemplate, usexloc, useyloc, tovis);
                }
            }
        }
    }
    else
    {
            /* un-draw the individual points */
        if (scalarvis != 0)
        {
            int i;
            for (i = 0; i < nelem; i++)
            {
                t_gobj *y;
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i), elemtemplate,
                            0, 0, 0);
                }
            }
        }
            /* and then the trace */
        pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}